

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int eventSetFunc(uint event,eventFunc_t f)

{
  FILE *__stream;
  int iVar1;
  
  __stream = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(__stream,"%s %s: event=%d function=%08X\n",myTimeStamp::buf,"eventSetFunc",event,
            (ulong)f & 0xffffffff);
  }
  if (libInitialised == '\0') {
    iVar1 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      eventSetFunc_cold_1();
    }
  }
  else if (event < 0x20) {
    iVar1 = 0;
    intEventSetFunc(event,f,0,(void *)0x0);
  }
  else {
    iVar1 = -0x8f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      eventSetFunc_cold_2();
    }
  }
  return iVar1;
}

Assistant:

int eventSetFunc(unsigned event, eventFunc_t f)
{
   DBG(DBG_USER, "event=%d function=%08X", event, (uint32_t)f);

   CHECK_INITED;

   if (event > PI_MAX_EVENT)
      SOFT_ERROR(PI_BAD_EVENT_ID, "bad event (%d)", event);

   intEventSetFunc(event, f, 0, NULL);

   return 0;
}